

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v7::detail::format_decimal<char,unsigned__int128>(char *out,unsigned___int128 value,int size)

{
  format_decimal_result<char_*> fVar1;
  uint uVar2;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar3 [16];
  char *end;
  ulong local_68;
  ulong local_60;
  char *local_50;
  char *local_30;
  
  auVar3._8_8_ = in_RDX;
  auVar3._0_8_ = in_RSI;
  local_50 = (char *)(in_RDI + in_ECX);
  while (local_60 = auVar3._8_8_, local_68 = auVar3._0_8_, (local_68 < 100) <= local_60) {
    local_50 = local_50 + -2;
    uVar2 = __umodti3(local_68,local_60);
    *(undefined2 *)local_50 = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar2 * 2);
    auVar3 = __udivti3(local_68,local_60,100,0);
  }
  if (local_60 == 0 && (ulong)(9 < local_68) <= -local_60) {
    local_68._0_1_ = auVar3[0];
    local_30 = local_50 + -1;
    local_50[-1] = (char)local_68 + '0';
  }
  else {
    local_30 = local_50 + -2;
    *(undefined2 *)local_30 = *(undefined2 *)(basic_data<void>::digits + local_68 * 2);
  }
  fVar1.end = (char *)(in_RDI + in_ECX);
  fVar1.begin = local_30;
  return fVar1;
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}